

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileBacktrace __thiscall cmListFileBacktrace::Pop(cmListFileBacktrace *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr *in_RSI;
  cmListFileBacktrace cVar3;
  shared_ptr<const_cmListFileBacktrace::Entry> local_28;
  cmListFileBacktrace *this_local;
  
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    __assert_fail("this->TopEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                  ,0x177,"cmListFileBacktrace cmListFileBacktrace::Pop() const");
  }
  peVar2 = std::
           __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_RSI);
  bVar1 = Entry::IsBottom(peVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!this->TopEntry->IsBottom()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                  ,0x178,"cmListFileBacktrace cmListFileBacktrace::Pop() const");
  }
  peVar2 = std::
           __shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_RSI);
  std::shared_ptr<const_cmListFileBacktrace::Entry>::shared_ptr(&local_28,&peVar2->Parent);
  cmListFileBacktrace(this,&local_28);
  std::shared_ptr<const_cmListFileBacktrace::Entry>::~shared_ptr(&local_28);
  cVar3.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar3.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar3.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Pop() const
{
  assert(this->TopEntry);
  assert(!this->TopEntry->IsBottom());
  return cmListFileBacktrace(this->TopEntry->Parent);
}